

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O0

void Utf32toUtf8(uint codepoint,char *utf8Buf)

{
  byte bVar1;
  char *utf8Buf_local;
  uint codepoint_local;
  
  bVar1 = (byte)codepoint;
  if (codepoint < 0x80) {
    *utf8Buf = bVar1;
    utf8Buf[1] = '\0';
  }
  else if (codepoint < 0x800) {
    *utf8Buf = (byte)(codepoint >> 6) | 0xc0;
    utf8Buf[1] = bVar1 & 0x3f | 0x80;
    utf8Buf[2] = '\0';
  }
  else if (codepoint < 0x10000) {
    *utf8Buf = (byte)(codepoint >> 0xc) | 0xe0;
    utf8Buf[1] = (byte)(codepoint >> 6) & 0x3f | 0x80;
    utf8Buf[2] = bVar1 & 0x3f | 0x80;
    utf8Buf[3] = '\0';
  }
  else if (codepoint < 0x200000) {
    *utf8Buf = (byte)(codepoint >> 0x12) | 0xf0;
    utf8Buf[1] = (byte)(codepoint >> 0xc) & 0x3f | 0x80;
    utf8Buf[2] = (byte)(codepoint >> 6) & 0x3f | 0x80;
    utf8Buf[3] = bVar1 & 0x3f | 0x80;
    utf8Buf[4] = '\0';
  }
  else {
    *utf8Buf = '?';
    utf8Buf[1] = '\0';
  }
  return;
}

Assistant:

static void Utf32toUtf8(unsigned int codepoint, char * utf8Buf) 
{
    if (codepoint < 0x80) {
        utf8Buf[0] = (char) codepoint;
        utf8Buf[1] = 0;
    } else if (codepoint < 0x0800) {
        utf8Buf[0] = (char) ((codepoint >> 6) | 0xC0);
        utf8Buf[1] = (char) ((codepoint & 0x3F) | 0x80);
        utf8Buf[2] = 0;
    } else if (codepoint < 0x10000) {
        utf8Buf[0] = (char) ((codepoint >> 12) | 0xE0);
        utf8Buf[1] = (char) (((codepoint >> 6) & 0x3F) | 0x80);
        utf8Buf[2] = (char) ((codepoint & 0x3F) | 0x80);
        utf8Buf[3] = 0;
    } else if (codepoint < 0x200000) {
        utf8Buf[0] =(char)((codepoint >> 18) | 0xF0);
        utf8Buf[1] =(char)(((codepoint >> 12) & 0x3F) | 0x80);
        utf8Buf[2] =(char)(((codepoint >> 6) & 0x3F) | 0x80);
        utf8Buf[3] =(char)((codepoint & 0x3F) | 0x80);
        utf8Buf[4] = 0;
    } else {
        utf8Buf[0] = '?';
        utf8Buf[1] = 0;
    }
}